

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async-io.c++
# Opt level: O2

Maybe<kj::Promise<unsigned_long>_> __thiscall
kj::anon_unknown_123::AsyncPipe::BlockedPumpTo::tryPumpFrom
          (BlockedPumpTo *this,AsyncInputStream *input,uint64_t amount2)

{
  AsyncInputStream *adapterConstructorParams;
  long lVar1;
  SourceLocation location;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 aVar2;
  void *pvVar3;
  ulong in_RCX;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 extraout_RDX;
  ulong uVar4;
  TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1366:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
  *location_00;
  bool bVar5;
  Maybe<kj::Promise<unsigned_long>_> MVar6;
  OwnPromiseNode intermediate;
  void *continuationTracePtr;
  DebugExpression<bool> _kjCondition;
  Fault f;
  OwnPromiseNode local_b8;
  anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2 local_b0;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_a8;
  code *local_a0;
  NullableValue<kj::Promise<unsigned_long>_> local_98;
  char *local_88;
  char *pcStack_80;
  undefined8 local_78;
  AsyncOutputStream local_70;
  anon_class_16_2_d8ee3cd1 local_68;
  anon_class_32_4_450de9d3_for_func local_58;
  Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> local_38;
  
  bVar5 = input[7]._vptr_AsyncInputStream == (_func_int **)0x0;
  local_88 = (char *)CONCAT71(local_88._1_7_,bVar5);
  if (bVar5) {
    uVar4 = (long)input[5]._vptr_AsyncInputStream - (long)input[6]._vptr_AsyncInputStream;
    if (in_RCX < uVar4) {
      uVar4 = in_RCX;
    }
    (**(code **)(*input[4]._vptr_AsyncInputStream + 0x10))
              (&local_98,input[4]._vptr_AsyncInputStream,amount2,uVar4);
    aVar2 = local_98.field_1;
    if (local_98.isSet == false) {
      *(undefined1 *)
       &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = 0;
    }
    else {
      adapterConstructorParams = input + 7;
      local_98.field_1 =
           (anon_union_8_1_a8c68091_for_NullableValue<kj::Promise<unsigned_long>_>_2)0x0;
      local_b0 = aVar2;
      local_68.fulfiller = (PromiseFulfiller<unsigned_long> *)input[2]._vptr_AsyncInputStream;
      local_88 = 
      "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
      ;
      pcStack_80 = "operator()";
      local_78 = 0x1e00000555;
      local_a0 = kj::_::
                 TransformPromiseNode<unsigned_long,_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:1366:19),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++:465:12)>
                 ::anon_class_32_4_450de9d3_for_func::operator();
      lVar1 = *(long *)((long)aVar2 + 8);
      local_68.canceler = (Canceler *)adapterConstructorParams;
      local_58.this = (BlockedPumpTo *)input;
      local_58.input = (AsyncInputStream *)amount2;
      local_58.n = uVar4;
      if (lVar1 == 0 || (ulong)((long)aVar2 - lVar1) < 0x50) {
        pvVar3 = operator_new(0x400);
        location_00 = (TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1366:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
                       *)((long)pvVar3 + 0x3b0);
        kj::operator()(location_00,
                       (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_b0.value,&local_58,
                       &local_68,&local_a0);
        *(void **)((long)pvVar3 + 0x3b8) = pvVar3;
      }
      else {
        *(undefined8 *)((long)aVar2 + 8) = 0;
        location_00 = (TransformPromiseNode<unsigned_long,_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:1366:19),_(lambda_at__workspace_llm4binary_github_license_c_cmakelists_capnproto[P]capnproto_c___src_kj_async_io_c__:465:12)>
                       *)((long)aVar2 + -0x50);
        kj::operator()(location_00,
                       (Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_b0.value,&local_58,
                       &local_68,&local_a0);
        *(long *)((long)aVar2 + -0x48) = lVar1;
      }
      location.function = pcStack_80;
      location.fileName = local_88;
      location.lineNumber = (undefined4)local_78;
      location.columnNumber = local_78._4_4_;
      local_a8.ptr = (PromiseNode *)location_00;
      kj::_::maybeChain<unsigned_long>(&local_b8,(Promise<unsigned_long> *)&local_a8,location);
      local_b8.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_b8);
      local_38.ptr = (PromiseNode *)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_38);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_a8);
      newAdaptedPromise<unsigned_long,kj::Canceler::AdapterImpl<unsigned_long>,kj::Canceler&,kj::Promise<unsigned_long>>
                ((kj *)&local_70,(Canceler *)adapterConstructorParams,
                 (Promise<unsigned_long> *)&local_b8);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose(&local_b8);
      *(undefined1 *)
       &(this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncInputStream.
        _vptr_AsyncInputStream = 1;
      (this->super_AsyncCapabilityStream).super_AsyncIoStream.super_AsyncOutputStream.
      _vptr_AsyncOutputStream = local_70._vptr_AsyncOutputStream;
      local_70._vptr_AsyncOutputStream = (_func_int **)0x0;
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_70);
      Own<kj::_::PromiseNode,_kj::_::PromiseDisposer>::dispose
                ((Own<kj::_::PromiseNode,_kj::_::PromiseDisposer> *)&local_b0.value);
    }
    kj::_::NullableValue<kj::Promise<unsigned_long>_>::~NullableValue(&local_98);
    MVar6.ptr.field_1 = extraout_RDX;
    MVar6.ptr._0_8_ = this;
    return (Maybe<kj::Promise<unsigned_long>_>)MVar6.ptr;
  }
  kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugExpression<bool>&,char_const(&)[16]>
            ((Fault *)&local_58,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async-io.c++"
             ,0x550,FAILED,"canceler.isEmpty()","_kjCondition,\"already pumping\"",
             (DebugExpression<bool> *)&local_88,(char (*) [16])"already pumping");
  kj::_::Debug::Fault::fatal((Fault *)&local_58);
}

Assistant:

TwoWayPipe newTwoWayPipe() {
  auto pipe1 = kj::refcounted<AsyncPipe>();
  auto pipe2 = kj::refcounted<AsyncPipe>();
  auto end1 = kj::heap<TwoWayPipeEnd>(kj::addRef(*pipe1), kj::addRef(*pipe2));
  auto end2 = kj::heap<TwoWayPipeEnd>(kj::mv(pipe2), kj::mv(pipe1));
  return { { kj::mv(end1), kj::mv(end2) } };
}